

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

void __thiscall
soul::SourceCodeUtilities::findRangeOfASTObject(soul::AST::ASTObject&)::FindLexicalRangeVisitor::
visitObject(soul::AST::ASTObject__(void *this,ASTObject *o)

{
  bool bVar1;
  UTF8Reader local_48 [3];
  UTF8Reader local_30;
  undefined1 local_28 [8];
  CodeLocation loc;
  ASTObject *o_local;
  FindLexicalRangeVisitor *this_local;
  
  loc.location.data = (char *)o;
  ASTVisitor::visitObject((ASTVisitor *)this,o);
  CodeLocation::CodeLocation((CodeLocation *)local_28,(CodeLocation *)(loc.location.data + 0x10));
  UTF8Reader::UTF8Reader(&local_30,(UTF8Reader *)((long)this + 0x10));
  bVar1 = UTF8Reader::operator<((UTF8Reader *)&loc,&local_30);
  if (bVar1) {
    CodeLocation::operator=((CodeLocation *)((long)this + 8),(CodeLocation *)local_28);
  }
  UTF8Reader::UTF8Reader(local_48,(UTF8Reader *)((long)this + 0x20));
  bVar1 = UTF8Reader::operator>((UTF8Reader *)&loc,local_48);
  if (bVar1) {
    CodeLocation::operator=((CodeLocation *)((long)this + 0x18),(CodeLocation *)local_28);
  }
  CodeLocation::~CodeLocation((CodeLocation *)local_28);
  return;
}

Assistant:

void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto loc = o.context.location;

            if (loc.location < range.start.location)  range.start = loc;
            if (loc.location > range.end.location)    range.end = loc;
        }